

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_pasv_resp(connectdata *conn,int ftpcode)

{
  int *piVar1;
  anon_union_8_11_9aa23c32_for_proto aVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  long lVar6;
  uint port;
  uint uVar7;
  char *pcVar8;
  _Bool protocol4a;
  SessionHandle *data;
  uint uVar9;
  _Bool connected;
  Curl_addrinfo *conninfo;
  Curl_dns_entry *addr;
  char newhost [48];
  uint num;
  _Bool local_191;
  undefined8 local_190;
  int local_184;
  Curl_dns_entry *local_180;
  connectdata *local_178;
  SessionHandle *local_170;
  char local_168 [48];
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c [63];
  
  data = conn->data;
  local_180 = (Curl_dns_entry *)0x0;
  pcVar5 = (data->state).buffer + 4;
  iVar3 = (conn->proto).ftpc.count1;
  local_184 = ftpcode;
  if (ftpcode != 0xe5 || iVar3 != 0) {
    if (ftpcode != 0xe3 || iVar3 != 1) {
      if (iVar3 != 0) {
        Curl_failf(data,"Bad PASV/EPSV response: %03d",ftpcode);
        return CURLE_FTP_WEIRD_PASV_REPLY;
      }
      (conn->bits).ftp_use_epsv = false;
      Curl_infof(data,"disabling EPSV usage\n");
      CVar4 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PASV",0);
      if (CVar4 == CURLE_OK) {
        piVar1 = &(conn->proto).ftpc.count1;
        *piVar1 = *piVar1 + 1;
        return CURLE_OK;
      }
      return CVar4;
    }
    local_178 = conn;
    local_170 = data;
    if (*pcVar5 != '\0') {
      do {
        iVar3 = __isoc99_sscanf(pcVar5,"%d,%d,%d,%d,%d,%d",&local_138,&local_134,&local_130,
                                local_12c,&local_190,(long)&local_190 + 4);
        data = local_170;
        conn = local_178;
        if (iVar3 == 6) {
          if (*pcVar5 != '\0') {
            if ((local_170->set).ftp_skip_ip == true) {
              pcVar5 = local_178->ip_addr_str;
              Curl_infof(local_170,"Skips %d.%d.%d.%d for data connection, uses %s instead\n",
                         (ulong)local_138,(ulong)local_134,(ulong)local_130,(ulong)local_12c[0],
                         pcVar5);
              if (((conn->bits).tunnel_proxy != false) ||
                 ((conn->proxytype & 0xfffffffc) == CURLPROXY_SOCKS4)) {
                pcVar5 = (conn->host).name;
              }
              curl_msnprintf(local_168,0x30,"%s",pcVar5);
            }
            else {
              curl_msnprintf(local_168,0x30,"%d.%d.%d.%d");
              conn = local_178;
            }
            uVar7 = (int)local_190 * 0x100 + local_190._4_4_;
            goto LAB_00116329;
          }
          break;
        }
        pcVar8 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while (*pcVar8 != '\0');
    }
    Curl_failf(local_170,"Couldn\'t interpret the 227-response");
    return CURLE_FTP_WEIRD_227_FORMAT;
  }
  pcVar5 = strchr(pcVar5,0x28);
  if ((pcVar5 == (char *)0x0) ||
     (iVar3 = __isoc99_sscanf(pcVar5 + 1,"%c%c%c%u%c",&local_190,(long)&local_190 + 1,
                              (long)&local_190 + 2,&local_138,(long)&local_190 + 3), iVar3 != 5)) {
LAB_0011619a:
    Curl_failf(data,"Weirdly formatted EPSV reply");
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }
  lVar6 = 1;
  do {
    if (*(char *)((long)&local_190 + lVar6) != (char)local_190) goto LAB_0011619a;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  uVar7 = local_138 & 0xffff;
  if (((conn->bits).tunnel_proxy == false) && ((conn->proxytype & 0xfffffffc) != CURLPROXY_SOCKS4))
  {
    pcVar5 = conn->ip_addr_str;
  }
  else {
    pcVar5 = (conn->host).name;
  }
  curl_msnprintf(local_168,0x30,"%s",pcVar5);
LAB_00116329:
  pcVar5 = (data->set).str[0x10];
  if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
    port = uVar7 & 0xffff;
    Curl_resolv(conn,local_168,port,&local_180);
    uVar9 = uVar7;
    if (local_180 == (Curl_dns_entry *)0x0) {
      pcVar8 = "Can\'t resolve new host %s:%hu";
      pcVar5 = local_168;
      goto LAB_001164af;
    }
  }
  else {
    Curl_resolv(conn,(conn->proxy).name,(int)conn->port,&local_180);
    uVar9 = (uint)conn->port;
    if (local_180 == (Curl_dns_entry *)0x0) {
      pcVar5 = (conn->proxy).name;
      port = uVar9 & 0xffff;
      pcVar8 = "Can\'t resolve proxy host %s:%hu";
LAB_001164af:
      Curl_failf(data,pcVar8,pcVar5,(ulong)port);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  CVar4 = Curl_connecthost(conn,local_180,conn->sock + 1,(Curl_addrinfo **)&local_190,&local_191);
  Curl_resolv_unlock(data,local_180);
  if (CVar4 != CURLE_OK) goto LAB_001163dd;
  (conn->bits).tcpconnect[1] = local_191;
  if ((data->set).verbose == true) {
    Curl_printable_address
              ((Curl_addrinfo *)CONCAT44(local_190._4_4_,(int)local_190),(char *)&local_138,0x100);
    Curl_infof(conn->data,"Connecting to %s (%s) port %d\n",local_168,&local_138,
               (ulong)(uVar9 & 0xffff));
  }
  switch(conn->proxytype) {
  case CURLPROXY_HTTP:
  case CURLPROXY_HTTP_1_0:
    goto switchD_00116474_caseD_0;
  default:
    Curl_failf(data,"unknown proxytype option given");
    CVar4 = CURLE_COULDNT_CONNECT;
    goto LAB_001163dd;
  case CURLPROXY_SOCKS4:
    pcVar5 = conn->proxyuser;
    protocol4a = false;
    break;
  case CURLPROXY_SOCKS5:
  case CURLPROXY_SOCKS5_HOSTNAME:
    CVar4 = Curl_SOCKS5(conn->proxyuser,conn->proxypasswd,local_168,uVar7 & 0xffff,1,conn);
    goto LAB_0011651d;
  case CURLPROXY_SOCKS4A:
    pcVar5 = conn->proxyuser;
    protocol4a = true;
  }
  CVar4 = Curl_SOCKS4(pcVar5,local_168,uVar7 & 0xffff,1,conn,protocol4a);
LAB_0011651d:
  if (CVar4 == CURLE_OK) {
switchD_00116474_caseD_0:
    if (((conn->bits).tunnel_proxy == true) && ((conn->bits).httpproxy == true)) {
      aVar2 = (data->state).proto;
      memset(&local_138,0,0x88);
      (data->state).proto.telnet = &local_138;
      CVar4 = Curl_proxyCONNECT(conn,1,local_168,(unsigned_short)uVar7);
      (data->state).proto = aVar2;
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
    }
    (conn->bits).tcpconnect[1] = true;
    (conn->proto).ftpc.state = FTP_STOP;
    return CURLE_OK;
  }
LAB_001163dd:
  if ((local_184 == 0xe5) && ((conn->proto).ftpc.count1 == 0)) {
    CVar4 = ftp_epsv_disable(conn);
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct SessionHandle *data=conn->data;
  Curl_addrinfo *conninfo;
  struct Curl_dns_entry *addr=NULL;
  int rc;
  unsigned short connectport; /* the local port connect() should use! */
  unsigned short newport=0; /* remote port */
  bool connected;

  /* newhost must be able to hold a full IP-style address in ASCII, which
     in the IPv6 case means 5*8-1 = 39 letters */
#define NEWHOST_BUFSIZE 48
  char newhost[NEWHOST_BUFSIZE];
  char *str=&data->state.buffer[4];  /* start on the first letter */

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5  == sscanf(ptr, "%c%c%c%u%c",
                      &separator[0],
                      &separator[1],
                      &separator[2],
                      &num,
                      &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i=1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr=NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(ptr) {
          newport = (unsigned short)(num & 0xffff);

          if(conn->bits.tunnel_proxy ||
             conn->proxytype == CURLPROXY_SOCKS5 ||
             conn->proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
             conn->proxytype == CURLPROXY_SOCKS4 ||
             conn->proxytype == CURLPROXY_SOCKS4A)
            /* proxy tunnel -> use other host info because ip_addr_str is the
               proxy address not the ftp host */
            snprintf(newhost, sizeof(newhost), "%s", conn->host.name);
          else
            /* use the same IP we are already connected to */
            snprintf(newhost, NEWHOST_BUFSIZE, "%s", conn->ip_addr_str);
        }
      }
      else
        ptr=NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    int ip[4];
    int port[2];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%d,%d,%d,%d,%d,%d",
                      &ip[0], &ip[1], &ip[2], &ip[3],
                      &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the one we used
         for the control connection */
      infof(data, "Skips %d.%d.%d.%d for data connection, uses %s instead\n",
            ip[0], ip[1], ip[2], ip[3],
            conn->ip_addr_str);
      if(conn->bits.tunnel_proxy ||
         conn->proxytype == CURLPROXY_SOCKS5 ||
         conn->proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
         conn->proxytype == CURLPROXY_SOCKS4 ||
         conn->proxytype == CURLPROXY_SOCKS4A)
        /* proxy tunnel -> use other host info because ip_addr_str is the
           proxy address not the ftp host */
        snprintf(newhost, sizeof(newhost), "%s", conn->host.name);
      else
        snprintf(newhost, sizeof(newhost), "%s", conn->ip_addr_str);
    }
    else
      snprintf(newhost, sizeof(newhost),
               "%d.%d.%d.%d", ip[0], ip[1], ip[2], ip[3]);
    newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */

    /* disable it for next transfer */
    conn->bits.ftp_use_epsv = FALSE;
    infof(data, "disabling EPSV usage\n");

    PPSENDF(&ftpc->pp, "PASV", NULL);
    ftpc->count1++;
    /* remain in the FTP_PASV state */
    return result;
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

  if(data->set.str[STRING_PROXY] && *data->set.str[STRING_PROXY]) {
    /*
     * This is a tunnel through a http proxy and we need to connect to the
     * proxy again here.
     *
     * We don't want to rely on a former host lookup that might've expired
     * now, instead we remake the lookup here and now!
     */
    rc = Curl_resolv(conn, conn->proxy.name, (int)conn->port, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu",
            conn->proxy.name, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    /* normal, direct, ftp connection */
    rc = Curl_resolv(conn, newhost, newport, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport = newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  result = Curl_connecthost(conn,
                            addr,
                            &conn->sock[SECONDARYSOCKET],
                            &conninfo,
                            &connected);

  Curl_resolv_unlock(data, addr); /* we're done using this address */

  if(result) {
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);

    return result;
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = connected;

  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect and we should not be "hanging" here waiting.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(conn, conninfo, newhost, connectport);

  switch(conn->proxytype) {
    /* FIX: this MUST wait for a proper connect first if 'connected' is
     * FALSE */
  case CURLPROXY_SOCKS5:
  case CURLPROXY_SOCKS5_HOSTNAME:
    result = Curl_SOCKS5(conn->proxyuser, conn->proxypasswd, newhost, newport,
                         SECONDARYSOCKET, conn);
    break;
  case CURLPROXY_SOCKS4:
    result = Curl_SOCKS4(conn->proxyuser, newhost, newport,
                         SECONDARYSOCKET, conn, FALSE);
    break;
  case CURLPROXY_SOCKS4A:
    result = Curl_SOCKS4(conn->proxyuser, newhost, newport,
                         SECONDARYSOCKET, conn, TRUE);
    break;
  case CURLPROXY_HTTP:
  case CURLPROXY_HTTP_1_0:
    /* do nothing here. handled later. */
    break;
  default:
    failf(data, "unknown proxytype option given");
    result = CURLE_COULDNT_CONNECT;
    break;
  }

  if(result) {
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);
    return result;
  }

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
    /* FIX: this MUST wait for a proper connect first if 'connected' is
     * FALSE */

    /* BLOCKING */
    /* We want "seamless" FTP operations through HTTP proxy tunnel */

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the member
     * conn->proto.http; we want FTP through HTTP and we have to change the
     * member temporarily for connecting to the HTTP proxy. After
     * Curl_proxyCONNECT we have to set back the member to the original struct
     * FTP pointer
     */
    struct HTTP http_proxy;
    struct FTP *ftp_save = data->state.proto.ftp;
    memset(&http_proxy, 0, sizeof(http_proxy));
    data->state.proto.http = &http_proxy;

    result = Curl_proxyCONNECT(conn, SECONDARYSOCKET, newhost, newport);

    data->state.proto.ftp = ftp_save;

    if(result)
      return result;
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(conn, FTP_STOP); /* this phase is completed */

  return result;
}